

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O1

size_t sse4_despace_branchless_u2(char *bytes,size_t howmany)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (howmany < 0x20) {
    uVar8 = 0;
    sVar7 = 0;
  }
  else {
    sVar7 = 0;
    auVar11[8] = 0x20;
    auVar11._0_8_ = 0x2020202020202020;
    auVar11[9] = 0x20;
    auVar11[10] = 0x20;
    auVar11[0xb] = 0x20;
    auVar11[0xc] = 0x20;
    auVar11[0xd] = 0x20;
    auVar11[0xe] = 0x20;
    auVar11[0xf] = 0x20;
    auVar13[8] = 10;
    auVar13._0_8_ = 0xa0a0a0a0a0a0a0a;
    auVar13[9] = 10;
    auVar13[10] = 10;
    auVar13[0xb] = 10;
    auVar13[0xc] = 10;
    auVar13[0xd] = 10;
    auVar13[0xe] = 10;
    auVar13[0xf] = 10;
    auVar15[8] = 0xd;
    auVar15._0_8_ = 0xd0d0d0d0d0d0d0d;
    auVar15[9] = 0xd;
    auVar15[10] = 0xd;
    auVar15[0xb] = 0xd;
    auVar15[0xc] = 0xd;
    auVar15[0xd] = 0xd;
    auVar15[0xe] = 0xd;
    auVar15[0xf] = 0xd;
    uVar6 = 0;
    do {
      uVar8 = uVar6 + 0x20;
      auVar12 = *(undefined1 (*) [16])(bytes + uVar6);
      auVar14 = *(undefined1 (*) [16])(bytes + uVar6 + 0x10);
      uVar2 = vpcmpeqb_avx512vl(auVar12,auVar11);
      uVar3 = vpcmpeqb_avx512vl(auVar12,auVar13);
      uVar4 = vpcmpeqb_avx512vl(auVar12,auVar15);
      uVar5 = (uint)(ushort)((ushort)uVar3 | (ushort)uVar2 | (ushort)uVar4);
      auVar12 = vpshufb_avx(auVar12,*(undefined1 (*) [16])("" + ((uVar5 & 0x7fff) << 4)));
      *(undefined1 (*) [16])(bytes + sVar7) = auVar12;
      lVar10 = (0x10 - POPCOUNT(uVar5)) + sVar7;
      uVar2 = vpcmpeqb_avx512vl(auVar14,auVar11);
      uVar3 = vpcmpeqb_avx512vl(auVar14,auVar13);
      uVar4 = vpcmpeqb_avx512vl(auVar14,auVar15);
      uVar5 = (uint)(ushort)((ushort)uVar3 | (ushort)uVar2 | (ushort)uVar4);
      auVar12 = vpshufb_avx(auVar14,*(undefined1 (*) [16])("" + ((uVar5 & 0x7fff) << 4)));
      *(undefined1 (*) [16])(bytes + lVar10) = auVar12;
      sVar7 = (ulong)(0x10 - POPCOUNT(uVar5)) + lVar10;
      uVar9 = uVar6 + 0x3f;
      uVar6 = uVar8;
    } while (uVar9 < howmany);
  }
  if ((uVar8 | 0xf) < howmany) {
    auVar12[8] = 0x20;
    auVar12._0_8_ = 0x2020202020202020;
    auVar12[9] = 0x20;
    auVar12[10] = 0x20;
    auVar12[0xb] = 0x20;
    auVar12[0xc] = 0x20;
    auVar12[0xd] = 0x20;
    auVar12[0xe] = 0x20;
    auVar12[0xf] = 0x20;
    auVar14[8] = 10;
    auVar14._0_8_ = 0xa0a0a0a0a0a0a0a;
    auVar14[9] = 10;
    auVar14[10] = 10;
    auVar14[0xb] = 10;
    auVar14[0xc] = 10;
    auVar14[0xd] = 10;
    auVar14[0xe] = 10;
    auVar14[0xf] = 10;
    auVar16[8] = 0xd;
    auVar16._0_8_ = 0xd0d0d0d0d0d0d0d;
    auVar16[9] = 0xd;
    auVar16[10] = 0xd;
    auVar16[0xb] = 0xd;
    auVar16[0xc] = 0xd;
    auVar16[0xd] = 0xd;
    auVar16[0xe] = 0xd;
    auVar16[0xf] = 0xd;
    uVar6 = uVar8;
    do {
      uVar8 = uVar6 + 0x10;
      auVar11 = *(undefined1 (*) [16])(bytes + uVar6);
      uVar2 = vpcmpeqb_avx512vl(auVar11,auVar12);
      uVar3 = vpcmpeqb_avx512vl(auVar11,auVar14);
      uVar4 = vpcmpeqb_avx512vl(auVar11,auVar16);
      uVar5 = (uint)(ushort)((ushort)uVar3 | (ushort)uVar2 | (ushort)uVar4);
      auVar11 = vpshufb_avx(auVar11,*(undefined1 (*) [16])("" + ((uVar5 & 0x7fff) << 4)));
      *(undefined1 (*) [16])(bytes + sVar7) = auVar11;
      sVar7 = (0x10 - POPCOUNT(uVar5)) + sVar7;
      uVar9 = uVar6 + 0x1f;
      uVar6 = uVar8;
    } while (uVar9 < howmany);
  }
  if (uVar8 < howmany) {
    do {
      bVar1 = bytes[uVar8];
      if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
        bytes[sVar7] = bVar1;
        sVar7 = sVar7 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (howmany != uVar8);
  }
  return sVar7;
}

Assistant:

size_t sse4_despace_branchless_u2(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m128i spaces = _mm_set1_epi8(' ');
  __m128i newline = _mm_set1_epi8('\n');
  __m128i carriage = _mm_set1_epi8('\r');
  size_t i = 0;
  for (; i + 32 - 1 < howmany; i += 32) {
    __m128i x1 = _mm_loadu_si128((const __m128i *)(bytes + i));
    __m128i x2 = _mm_loadu_si128((const __m128i *)(bytes + i + 16));
    int mask16;
    x1 = cleanm128(x1, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x1);
    pos += 16 - _mm_popcnt_u32(mask16);

    x2 = cleanm128(x2, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x2);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i + 16 - 1 < howmany; i += 16) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int mask16;
    x = cleanm128(x, spaces, newline, carriage, &mask16);
    _mm_storeu_si128((__m128i *)(bytes + pos), x);
    pos += 16 - _mm_popcnt_u32(mask16);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}